

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SpecparamSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SpecparamSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  string_view name;
  SpecparamSymbol *this_00;
  
  this_00 = (SpecparamSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SpecparamSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (SpecparamSymbol *)allocateSlow(this,0x180,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::ValueSymbol::ValueSymbol
            (&this_00->super_ValueSymbol,Specparam,name,*args_1,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x3);
  this_00->isPathPulse = false;
  this_00->value1 = (ConstantValue *)0x0;
  this_00->value2 = (ConstantValue *)0x0;
  this_00->pathSource = (Symbol *)0x0;
  this_00->pathDest = (Symbol *)0x0;
  this_00->evaluating = false;
  this_00->pathPulseResolved = false;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }